

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O0

string_view bloaty::dwarf::AttrValue::ReadVariableBlock(string_view *data)

{
  unsigned_long bytes;
  string_view sVar1;
  string_view sVar2;
  uint64_t len;
  string_view *in_stack_ffffffffffffffd8;
  string_view *in_stack_fffffffffffffff0;
  
  bytes = ReadLEB128<unsigned_long>(in_stack_fffffffffffffff0);
  sVar1 = ReadBytes(bytes,in_stack_ffffffffffffffd8);
  sVar2._M_len = sVar1._M_len;
  sVar2._M_str = sVar1._M_str;
  return sVar2;
}

Assistant:

string_view AttrValue::ReadVariableBlock(string_view* data) {
  uint64_t len = ReadLEB128<uint64_t>(data);
  return ReadBytes(len, data);
}